

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O1

Endpoint * __thiscall twitter::zipkin::thrift::Endpoint::operator=(Endpoint *this,Endpoint *other1)

{
  this->ipv4 = other1->ipv4;
  this->port = other1->port;
  std::__cxx11::string::_M_assign((string *)&this->service_name);
  std::__cxx11::string::_M_assign((string *)&this->ipv6);
  this->__isset = other1->__isset;
  return this;
}

Assistant:

Endpoint& Endpoint::operator=(const Endpoint& other1) {
  ipv4 = other1.ipv4;
  port = other1.port;
  service_name = other1.service_name;
  ipv6 = other1.ipv6;
  __isset = other1.__isset;
  return *this;
}